

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O0

int cvLsJacTimesSetupBSWrapper(sunrealtype t,N_Vector yB,N_Vector fyB,void *cvode_mem)

{
  int iVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  int retval;
  CVLsMemB cvlsB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  CVodeBMem *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  CVodeMem *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  CVodeMem local_30;
  int local_4;
  
  local_4 = cvLs_AccessLMemBCur(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                                in_stack_ffffffffffffffb8,
                                (CVadjMem *)
                                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                in_stack_ffffffffffffffa8,(CVLsMemB *)0x13ee9e);
  if (local_4 == 0) {
    if (*(int *)((long)in_stack_ffffffffffffffc8 + 0xbc) == 0) {
      iVar1 = (**(code **)((long)in_stack_ffffffffffffffc8 + 0xa8))
                        (in_XMM0_Qa,local_30,
                         *(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0x1f8),0);
    }
    else {
      iVar1 = (**(code **)((long)in_stack_ffffffffffffffc8 + 0xa8))
                        (in_XMM0_Qa,local_30,
                         *(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0x1f8),
                         *(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0x200));
    }
    if (iVar1 == 0) {
      local_4 = (*(code *)in_stack_ffffffffffffffb8[3])
                          (in_XMM0_Qa,*(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0x1f8),
                           *(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0x200),in_RDI,in_RSI,
                           *(undefined8 *)(in_stack_ffffffffffffffc0 + 0x40));
    }
    else {
      cvProcessError(local_30,-1,0xa7e,"cvLsJacTimesSetupBSWrapper",
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_ls.c"
                     ,"Bad t for interpolation.");
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int cvLsJacTimesSetupBSWrapper(sunrealtype t, N_Vector yB, N_Vector fyB,
                                      void* cvode_mem)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  CVLsMemB cvlsB_mem;
  int retval;

  /* access relevant memory structures */
  retval = cvLs_AccessLMemBCur(cvode_mem, "cvLsJacTimesSetupBSWrapper", &cv_mem,
                               &ca_mem, &cvB_mem, &cvlsB_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Forward solution from interpolation */
  if (ca_mem->ca_IMinterpSensi)
  {
    retval = ca_mem->ca_IMget(cv_mem, t, ca_mem->ca_ytmp, ca_mem->ca_yStmp);
  }
  else { retval = ca_mem->ca_IMget(cv_mem, t, ca_mem->ca_ytmp, NULL); }
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSG_LS_BAD_TINTERP);
    return (-1);
  }

  /* Call user's adjoint jtsetupBS routine */
  return (cvlsB_mem->jtsetupBS(t, ca_mem->ca_ytmp, ca_mem->ca_yStmp, yB, fyB,
                               cvB_mem->cv_user_data));
}